

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_memory_manager.cpp
# Opt level: O1

void __thiscall
duckdb::TemporaryMemoryState::SetRemainingSizeAndUpdateReservation
          (TemporaryMemoryState *this,ClientContext *context,idx_t new_remaining_size)

{
  idx_t *piVar1;
  TemporaryMemoryManager *pTVar2;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->temporary_memory_manager->lock;
  local_30._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  pTVar2 = this->temporary_memory_manager;
  piVar1 = &pTVar2->remaining_size;
  *piVar1 = *piVar1 - (this->remaining_size).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  (this->remaining_size).super___atomic_base<unsigned_long>._M_i = new_remaining_size;
  UNLOCK();
  piVar1 = &pTVar2->remaining_size;
  *piVar1 = *piVar1 + (this->remaining_size).super___atomic_base<unsigned_long>._M_i;
  TemporaryMemoryManager::UpdateState(this->temporary_memory_manager,context,this);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void TemporaryMemoryState::SetRemainingSizeAndUpdateReservation(ClientContext &context, idx_t new_remaining_size) {
	D_ASSERT(new_remaining_size != 0); // Use SetZero instead
	auto guard = temporary_memory_manager.Lock();
	temporary_memory_manager.SetRemainingSize(*this, new_remaining_size);
	temporary_memory_manager.UpdateState(context, *this);
}